

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::Cond<tcu::Vector<float,_3>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_3>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  undefined7 uVar1;
  Interval *pIVar2;
  long lVar3;
  IVal *pIVar4;
  IRet *pIVar5;
  byte bVar6;
  double dVar7;
  IVal local_60;
  
  bVar6 = 0;
  tcu::Vector<tcu::Interval,_3>::Vector(__return_storage_ptr__);
  pIVar2 = iargs->a;
  dVar7 = pIVar2->m_lo;
  if ((dVar7 <= 1.0) && (1.0 <= pIVar2->m_hi)) {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
              (&local_60,__return_storage_ptr__,iargs->b);
    pIVar4 = &local_60;
    pIVar5 = __return_storage_ptr__;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined7 *)&pIVar4->m_data[0].field_0x1;
      pIVar5->m_data[0].m_hasNaN = pIVar4->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar5->m_data[0].field_0x1 = uVar1;
      pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pIVar5 = (IRet *)((long)pIVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    pIVar2 = iargs->a;
    dVar7 = pIVar2->m_lo;
  }
  if ((dVar7 <= 0.0) && (0.0 <= pIVar2->m_hi)) {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
              (&local_60,__return_storage_ptr__,iargs->c);
    pIVar4 = &local_60;
    pIVar5 = __return_storage_ptr__;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      uVar1 = *(undefined7 *)&pIVar4->m_data[0].field_0x1;
      pIVar5->m_data[0].m_hasNaN = pIVar4->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar5->m_data[0].field_0x1 = uVar1;
      pIVar4 = (IVal *)((long)pIVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pIVar5 = (IRet *)((long)pIVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}